

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::SequenceMethod::SequenceMethod
          (SequenceMethod *this,KnownSystemName knownNameId,bool isMatched)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,knownNameId,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005b10a0;
  this->isMatched = isMatched;
  return;
}

Assistant:

SequenceMethod(KnownSystemName knownNameId, bool isMatched) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), isMatched(isMatched) {}